

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall singleParticleSpectra::outputRapidityPTDistribution(singleParticleSpectra *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  long lVar5;
  undefined1 auVar6 [16];
  ostream *poVar7;
  long lVar8;
  long lVar9;
  int iorder;
  long lVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dStack_3f0;
  string rapName;
  char *local_3c8 [4];
  ofstream output;
  undefined8 auStack_3a0 [2];
  uint auStack_390 [122];
  ostringstream filename;
  
  std::__cxx11::string::string((string *)&rapName,"eta",(allocator *)&output);
  if (this->rap_type == 1) {
    std::__cxx11::string::assign((char *)&rapName);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
  poVar7 = std::operator<<((ostream *)&filename,(string *)this);
  poVar7 = std::operator<<(poVar7,"/particle_");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->particle_monval);
  poVar7 = std::operator<<(poVar7,"_pT");
  poVar7 = std::operator<<(poVar7,(string *)&rapName);
  std::operator<<(poVar7,"_distribution");
  if (this->bWeakFeedDown_ == true) {
    std::operator<<((ostream *)&filename,"_weakFD");
  }
  std::operator<<((ostream *)&filename,".dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output,local_3c8[0],_S_out);
  std::__cxx11::string::~string((string *)local_3c8);
  poVar7 = std::operator<<((ostream *)&output,"# y  pT  N  E_T");
  poVar7 = std::operator<<(poVar7,"  Qn_real  Qn_imag (n = 1 -");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->order_max + -1);
  poVar7 = std::operator<<(poVar7,")");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&output,"# Nev = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->total_number_of_events);
  poVar7 = std::operator<<(poVar7," d");
  poVar7 = std::operator<<(poVar7,(string *)&rapName);
  std::operator<<(poVar7," = ");
  poVar7 = std::ostream::_M_insert<double>(this->drap);
  std::operator<<(poVar7," dpT = ");
  poVar7 = std::ostream::_M_insert<double>(this->dpT);
  poVar7 = std::operator<<(poVar7," GeV");
  std::endl<char,std::char_traits<char>>(poVar7);
  for (lVar8 = 0; lVar8 < this->N_rap; lVar8 = lVar8 + 1) {
    dVar12 = (this->rapidity_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
    for (lVar11 = 0; lVar11 < this->npT; lVar11 = lVar11 + 1) {
      pauVar4 = *(undefined1 (**) [16])
                 (*(long *)&(this->Qn_pTrapdiff_vector).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar11 * 0x18);
      dVar1 = *(double *)pauVar4[1];
      if (dVar1 <= 0.0) {
        auVar13._8_8_ =
             (this->pT_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
        auVar13._0_8_ = dVar12;
      }
      else {
        auVar6._8_8_ = dVar1;
        auVar6._0_8_ = dVar1;
        auVar13 = divpd(*pauVar4,auVar6);
      }
      iVar3 = this->total_number_of_events;
      dVar2 = *(double *)(pauVar4[1] + 8);
      *(uint *)((long)auStack_390 + *(long *)(_output + -0x18)) =
           *(uint *)((long)auStack_390 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_3a0 + *(long *)(_output + -0x18)) = 8;
      dVar12 = auVar13._0_8_;
      poVar7 = std::ostream::_M_insert<double>(dVar12);
      std::operator<<(poVar7,"  ");
      dStack_3f0 = auVar13._8_8_;
      poVar7 = std::ostream::_M_insert<double>(dStack_3f0);
      std::operator<<(poVar7,"  ");
      poVar7 = std::ostream::_M_insert<double>(dVar1 / (double)iVar3);
      std::operator<<(poVar7,"  ");
      std::ostream::_M_insert<double>(dVar2 / (double)iVar3);
      lVar9 = 0x28;
      for (lVar10 = 1; lVar10 < this->order_max; lVar10 = lVar10 + 1) {
        lVar5 = *(long *)(*(long *)&(this->Qn_pTrapdiff_vector).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar11 * 0x18);
        dVar1 = *(double *)(lVar5 + -8 + lVar9);
        dVar2 = *(double *)(lVar5 + lVar9);
        iVar3 = this->total_number_of_events;
        std::operator<<((ostream *)&output,"  ");
        poVar7 = std::ostream::_M_insert<double>(dVar1 / (double)iVar3);
        std::operator<<(poVar7,"  ");
        std::ostream::_M_insert<double>(dVar2 / (double)iVar3);
        lVar9 = lVar9 + 0x10;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&output);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
  std::__cxx11::string::~string((string *)&rapName);
  return;
}

Assistant:

void singleParticleSpectra::outputRapidityPTDistribution() {
    std::string rapName = "eta";
    if (rap_type == 1) {
        rapName = "y";
    }
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_pT" << rapName
             << "_distribution";
    if (bWeakFeedDown_) filename << "_weakFD";
    filename << ".dat";
    ofstream output(filename.str().c_str());
    output << "# y  pT  N  E_T"
           << "  Qn_real  Qn_imag (n = 1 -" << order_max - 1 << ")" << endl;
    output << "# Nev = " << total_number_of_events << " d" << rapName << " = "
           << drap << " dpT = " << dpT << " GeV" << endl;

    for (int i = 0; i < N_rap; i++) {
        double rap_bin_mid = rapidity_array[i];
        for (int j = 0; j < npT; j++) {
            double pT_bin_mid = pT_array[j];
            if (Qn_pTrapdiff_vector[i][j][2] > 0) {
                rap_bin_mid =
                    (Qn_pTrapdiff_vector[i][j][0]
                     / Qn_pTrapdiff_vector[i][j][2]);
                pT_bin_mid =
                    (Qn_pTrapdiff_vector[i][j][1]
                     / Qn_pTrapdiff_vector[i][j][2]);
            }
            double dN = Qn_pTrapdiff_vector[i][j][2] / total_number_of_events;
            double dET = Qn_pTrapdiff_vector[i][j][3] / total_number_of_events;
            output << scientific << setprecision(8) << rap_bin_mid << "  "
                   << pT_bin_mid << "  " << dN << "  " << dET;
            // vn
            for (int iorder = 1; iorder < order_max; iorder++) {
                double Qn_real =
                    (Qn_pTrapdiff_vector[i][j][2 * iorder + 2]
                     / total_number_of_events);
                double Qn_imag =
                    (Qn_pTrapdiff_vector[i][j][2 * iorder + 3]
                     / total_number_of_events);
                output << "  " << Qn_real << "  " << Qn_imag;
            }
            output << endl;
        }
    }
    output.close();
}